

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t canLz4(void)

{
  wchar_t wVar1;
  
  if (canLz4_tested == '\0') {
    canLz4_tested = '\x01';
    wVar1 = systemf("lz4 --help %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canLz4_value = 1;
    }
  }
  return (uint)canLz4_value;
}

Assistant:

int
canLz4(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lz4 --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}